

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckBlink(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  ctmbstr pString;
  ctmbstr word;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level2_Enabled(doc);
  if ((BVar1 != no) && (BVar1 = prvTidynodeIsText(node->content), BVar1 != no)) {
    pString = textFromOneNode(doc,node->content);
    BVar1 = IsWhitespace(pString);
    if (BVar1 == no) {
      prvTidyReportAccessError(doc,node,0x2e4);
    }
  }
  return;
}

Assistant:

static void CheckBlink( TidyDocImpl* doc, Node* node )
{
    
    if (Level2_Enabled( doc ))
    {
        /* Checks to see if text is found within the BLINK element. */
        if ( TY_(nodeIsText)(node->content) )
        {
            ctmbstr word = textFromOneNode( doc, node->content );
            if ( !IsWhitespace(word) )
            {
                TY_(ReportAccessError)( doc, node, REMOVE_BLINK_MARQUEE );
            }
        }
    }
}